

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef BinaryenArrayLen(BinaryenModuleRef module,BinaryenExpressionRef ref)

{
  ArrayLen *this;
  
  this = (ArrayLen *)MixedArena::allocSpace(&module->allocator,0x18,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)76>).super_Expression._id = ArrayLenId;
  (this->super_SpecificExpression<(wasm::Expression::Id)76>).super_Expression.type.id = 0;
  this->ref = ref;
  wasm::ArrayLen::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenArrayLen(BinaryenModuleRef module,
                                       BinaryenExpressionRef ref) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeArrayLen((Expression*)ref));
}